

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

void lys_free(lys_module *module,_func_void_lys_node_ptr_void_ptr *private_destructor,
             int remove_from_ctx)

{
  uint uVar1;
  ly_ctx *ctx;
  lys_module **pplVar2;
  long lVar3;
  ulong uVar4;
  
  if (module == (lys_module *)0x0) {
    return;
  }
  ctx = module->ctx;
  if ((remove_from_ctx != 0) && (uVar1 = (ctx->models).used, uVar1 != 0)) {
    lVar3 = 0;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (; uVar4 * 8 != lVar3; lVar3 = lVar3 + 8) {
      pplVar2 = (ctx->models).list;
      if (*(lys_module **)((long)pplVar2 + lVar3) == module) {
        (ctx->models).used = uVar1 - 1;
        memmove((void *)((long)pplVar2 + lVar3),*(void **)((long)pplVar2 + lVar3 + 8),
                (long)(int)(uVar1 - 1) * 8 - lVar3);
        (ctx->models).list[(ctx->models).used] = (lys_module *)0x0;
        break;
      }
    }
  }
  module_free_common(module,private_destructor);
  lydict_remove(ctx,module->ns);
  free(module);
  return;
}

Assistant:

void
lys_free(struct lys_module *module, void (*private_destructor)(const struct lys_node *node, void *priv), int remove_from_ctx)
{
    struct ly_ctx *ctx;
    int i;

    if (!module) {
        return;
    }

    /* remove schema from the context */
    ctx = module->ctx;
    if (remove_from_ctx && ctx->models.used) {
        for (i = 0; i < ctx->models.used; i++) {
            if (ctx->models.list[i] == module) {
                /* move all the models to not change the order in the list */
                ctx->models.used--;
                memmove(&ctx->models.list[i], ctx->models.list[i + 1], (ctx->models.used - i) * sizeof *ctx->models.list);
                ctx->models.list[ctx->models.used] = NULL;
                /* we are done */
                break;
            }
        }
    }

    /* common part with struct ly_submodule */
    module_free_common(module, private_destructor);

    /* specific items to free */
    lydict_remove(ctx, module->ns);

    free(module);
}